

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

char __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::FractionalDigitGenerator::GetOneDigit
          (FractionalDigitGenerator *this)

{
  reference puVar1;
  char cVar2;
  ulong uVar3;
  size_t i;
  
  i = this->after_chunk_index_;
  if (i == 0) {
    cVar2 = '\0';
  }
  else {
    uVar3 = 0;
    while( true ) {
      i = i - 1;
      cVar2 = (char)uVar3;
      if (i == 0xffffffffffffffff) break;
      puVar1 = Span<unsigned_int>::operator[](&this->data_,i);
      uVar3 = uVar3 + (ulong)*puVar1 * 10;
      *puVar1 = (uint)uVar3;
      uVar3 = uVar3 >> 0x20;
    }
    puVar1 = Span<unsigned_int>::operator[](&this->data_,this->after_chunk_index_ - 1);
    if (*puVar1 == 0) {
      this->after_chunk_index_ = this->after_chunk_index_ - 1;
    }
  }
  return cVar2;
}

Assistant:

char GetOneDigit() {
    if (!after_chunk_index_)
      return 0;

    char carry = 0;
    for (size_t i = after_chunk_index_; i > 0; --i) {
      carry = MultiplyBy10WithCarry(&data_[i - 1], carry);
    }
    // If the lowest chunk is now empty, remove it from view.
    if (data_[after_chunk_index_ - 1] == 0)
      --after_chunk_index_;
    return carry;
  }